

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_reflection_setters
          (t_java_generator *this,ostringstream *out,t_type *type,string *field_name,
          string *cap_name)

{
  int *piVar1;
  string *psVar2;
  int iVar3;
  ostream *poVar4;
  t_java_generator *this_00;
  string local_a0;
  t_type *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  local_80 = type;
  local_78 = cap_name;
  iVar3 = (*(type->super_t_doc)._vptr_t_doc[7])(type);
  poVar4 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  poVar4 = std::operator<<(poVar4,"case ");
  this_00 = (t_java_generator *)field_name;
  std::__cxx11::string::string((string *)&local_50,(string *)field_name);
  constant_name(&local_a0,this_00,&local_50);
  poVar4 = std::operator<<(poVar4,(string *)&local_a0);
  poVar4 = std::operator<<(poVar4,":");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_50);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  poVar4 = std::operator<<(poVar4,"if (value == null) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  poVar4 = std::operator<<(poVar4,"  unset");
  std::__cxx11::string::string((string *)&local_70,(string *)field_name);
  get_cap_name(&local_a0,this,&local_70);
  poVar4 = std::operator<<(poVar4,(string *)&local_a0);
  psVar2 = local_78;
  poVar4 = std::operator<<(poVar4,"();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  poVar4 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  poVar4 = std::operator<<(poVar4,"} else {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  if ((char)iVar3 != '\0') {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar4 = t_generator::indent((t_generator *)this,
                                 &out->super_basic_ostream<char,_std::char_traits<char>_>);
    poVar4 = std::operator<<(poVar4,"if (value instanceof byte[]) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,
                                 &out->super_basic_ostream<char,_std::char_traits<char>_>);
    poVar4 = std::operator<<(poVar4,"  set");
    poVar4 = std::operator<<(poVar4,(string *)psVar2);
    poVar4 = std::operator<<(poVar4,"((byte[])value);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,
                                 &out->super_basic_ostream<char,_std::char_traits<char>_>);
    poVar4 = std::operator<<(poVar4,"} else {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  poVar4 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  poVar4 = std::operator<<(poVar4,"  set");
  poVar4 = std::operator<<(poVar4,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"((");
  type_name_abi_cxx11_(&local_a0,this,local_80,true,false,false,false);
  poVar4 = std::operator<<(poVar4,(string *)&local_a0);
  poVar4 = std::operator<<(poVar4,")value);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a0);
  if ((char)iVar3 != '\0') {
    poVar4 = t_generator::indent((t_generator *)this,
                                 &out->super_basic_ostream<char,_std::char_traits<char>_>);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
  }
  poVar4 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  poVar4 = std::operator<<(poVar4,"break;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void t_java_generator::generate_reflection_setters(ostringstream& out,
                                                   t_type* type,
                                                   string field_name,
                                                   string cap_name) {
  const bool is_binary = type->is_binary();
  indent(out) << "case " << constant_name(field_name) << ":" << endl;
  indent_up();
  indent(out) << "if (value == null) {" << endl;
  indent(out) << "  unset" << get_cap_name(field_name) << "();" << endl;
  indent(out) << "} else {" << endl;
  if (is_binary) {
    indent_up();
    indent(out) << "if (value instanceof byte[]) {" << endl;
    indent(out) << "  set" << cap_name << "((byte[])value);" << endl;
    indent(out) << "} else {" << endl;
  }
  indent(out) << "  set" << cap_name << "((" << type_name(type, true, false) << ")value);" << endl;
  if (is_binary) {
    indent(out) << "}" << endl;
    indent_down();
  }
  indent(out) << "}" << endl;
  indent(out) << "break;" << endl << endl;

  indent_down();
}